

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O0

void duckdb_zstd::HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *args)

{
  undefined2 uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 *puVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  U64 UVar12;
  undefined8 *in_RDI;
  int nbBytes_3;
  int nbBits_3;
  int ctz_3;
  int nbBytes_2;
  int nbBits_2;
  int ctz_2;
  int nbBytes_1;
  int nbBits_1;
  int ctz_1;
  int nbBytes;
  int nbBits;
  int ctz;
  int entry_19;
  int index_19;
  int entry_18;
  int index_18;
  int entry_17;
  int index_17;
  int entry_16;
  int index_16;
  int entry_15;
  int index_15;
  int entry_14;
  int index_14;
  int entry_13;
  int index_13;
  int entry_12;
  int index_12;
  int entry_11;
  int index_11;
  int entry_10;
  int index_10;
  int entry_9;
  int index_9;
  int entry_8;
  int index_8;
  int entry_7;
  int index_7;
  int entry_6;
  int index_6;
  int entry_5;
  int index_5;
  int entry_4;
  int index_4;
  int entry_3;
  int index_3;
  int entry_2;
  int index_2;
  int entry_1;
  int index_1;
  int entry;
  int index;
  size_t symbols;
  size_t iters;
  size_t iiters;
  size_t oiters;
  int stream;
  BYTE *olimit;
  BYTE *ilowest;
  BYTE *oend;
  U16 *dtable;
  BYTE *op [4];
  BYTE *ip [4];
  U64 bits [4];
  ulong local_188;
  int local_8c;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  void *local_48 [4];
  U64 local_28;
  U64 local_20;
  U64 local_18;
  U64 local_10;
  undefined8 *local_8;
  
  lVar2 = in_RDI[0xc];
  lVar3 = in_RDI[0xe];
  lVar4 = in_RDI[0xd];
  local_28 = in_RDI[8];
  local_20 = in_RDI[9];
  local_18 = in_RDI[10];
  local_10 = in_RDI[0xb];
  local_48[0] = (void *)*in_RDI;
  local_48[1] = (void *)in_RDI[1];
  local_48[2] = (void *)in_RDI[2];
  local_48[3] = (void *)in_RDI[3];
  local_68 = (undefined1 *)in_RDI[4];
  local_60 = (undefined1 *)in_RDI[5];
  local_58 = (undefined1 *)in_RDI[6];
  local_50 = (undefined1 *)in_RDI[7];
  local_8 = in_RDI;
  while( true ) {
    uVar6 = (ulong)(lVar3 - (long)local_50) / 5;
    local_188 = (ulong)((long)local_48[0] - lVar4) / 7;
    if (uVar6 < local_188) {
      local_188 = uVar6;
    }
    puVar7 = local_50 + local_188 * 5;
    if (local_50 == puVar7) break;
    for (local_8c = 1; local_8c < 4; local_8c = local_8c + 1) {
      if (local_48[local_8c] < local_48[local_8c + -1]) goto LAB_00a8ce2c;
    }
    do {
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)(local_28 >> 0x35) * 2);
      lVar8 = local_28 << ((byte)uVar1 & 0x3f);
      *local_68 = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)(local_20 >> 0x35) * 2);
      lVar9 = local_20 << ((byte)uVar1 & 0x3f);
      *local_60 = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)(local_18 >> 0x35) * 2);
      lVar10 = local_18 << ((byte)uVar1 & 0x3f);
      *local_58 = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)(local_10 >> 0x35) * 2);
      lVar11 = local_10 << ((byte)uVar1 & 0x3f);
      *local_50 = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)((ulong)lVar8 >> 0x35) * 2);
      lVar8 = lVar8 << ((byte)uVar1 & 0x3f);
      local_68[1] = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)((ulong)lVar9 >> 0x35) * 2);
      lVar9 = lVar9 << ((byte)uVar1 & 0x3f);
      local_60[1] = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)((ulong)lVar10 >> 0x35) * 2);
      lVar10 = lVar10 << ((byte)uVar1 & 0x3f);
      local_58[1] = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)((ulong)lVar11 >> 0x35) * 2);
      lVar11 = lVar11 << ((byte)uVar1 & 0x3f);
      local_50[1] = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)((ulong)lVar8 >> 0x35) * 2);
      lVar8 = lVar8 << ((byte)uVar1 & 0x3f);
      local_68[2] = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)((ulong)lVar9 >> 0x35) * 2);
      lVar9 = lVar9 << ((byte)uVar1 & 0x3f);
      local_60[2] = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)((ulong)lVar10 >> 0x35) * 2);
      lVar10 = lVar10 << ((byte)uVar1 & 0x3f);
      local_58[2] = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)((ulong)lVar11 >> 0x35) * 2);
      lVar11 = lVar11 << ((byte)uVar1 & 0x3f);
      local_50[2] = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)((ulong)lVar8 >> 0x35) * 2);
      lVar8 = lVar8 << ((byte)uVar1 & 0x3f);
      local_68[3] = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)((ulong)lVar9 >> 0x35) * 2);
      lVar9 = lVar9 << ((byte)uVar1 & 0x3f);
      local_60[3] = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)((ulong)lVar10 >> 0x35) * 2);
      lVar10 = lVar10 << ((byte)uVar1 & 0x3f);
      local_58[3] = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)((ulong)lVar11 >> 0x35) * 2);
      lVar11 = lVar11 << ((byte)uVar1 & 0x3f);
      local_50[3] = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)((ulong)lVar8 >> 0x35) * 2);
      local_28 = lVar8 << ((byte)uVar1 & 0x3f);
      local_68[4] = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)((ulong)lVar9 >> 0x35) * 2);
      local_20 = lVar9 << ((byte)uVar1 & 0x3f);
      local_60[4] = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)((ulong)lVar10 >> 0x35) * 2);
      local_18 = lVar10 << ((byte)uVar1 & 0x3f);
      local_58[4] = (char)((ushort)uVar1 >> 8);
      uVar1 = *(undefined2 *)(lVar2 + (long)(int)(uint)((ulong)lVar11 >> 0x35) * 2);
      local_10 = lVar11 << ((byte)uVar1 & 0x3f);
      local_50[4] = (char)((ushort)uVar1 >> 8);
      uVar5 = ZSTD_countTrailingZeros64(local_28);
      local_68 = local_68 + 5;
      local_48[0] = (void *)((long)local_48[0] - (long)((int)uVar5 >> 3));
      UVar12 = MEM_read64(local_48[0]);
      local_28 = (UVar12 | 1) << ((byte)uVar5 & 7);
      uVar5 = ZSTD_countTrailingZeros64(local_20);
      local_60 = local_60 + 5;
      local_48[1] = (void *)((long)local_48[1] - (long)((int)uVar5 >> 3));
      UVar12 = MEM_read64(local_48[1]);
      local_20 = (UVar12 | 1) << ((byte)uVar5 & 7);
      uVar5 = ZSTD_countTrailingZeros64(local_18);
      local_58 = local_58 + 5;
      local_48[2] = (void *)((long)local_48[2] - (long)((int)uVar5 >> 3));
      UVar12 = MEM_read64(local_48[2]);
      local_18 = (UVar12 | 1) << ((byte)uVar5 & 7);
      uVar5 = ZSTD_countTrailingZeros64(local_10);
      local_50 = local_50 + 5;
      local_48[3] = (void *)((long)local_48[3] - (long)((int)uVar5 >> 3));
      UVar12 = MEM_read64(local_48[3]);
      local_10 = (UVar12 | 1) << ((byte)uVar5 & 7);
    } while (local_50 < puVar7);
  }
LAB_00a8ce2c:
  local_8[8] = local_28;
  local_8[9] = local_20;
  local_8[10] = local_18;
  local_8[0xb] = local_10;
  *local_8 = local_48[0];
  local_8[1] = local_48[1];
  local_8[2] = local_48[2];
  local_8[3] = local_48[3];
  local_8[4] = local_68;
  local_8[5] = local_60;
  local_8[6] = local_58;
  local_8[7] = local_50;
  return;
}

Assistant:

static HUF_FAST_BMI2_ATTRS
void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs* args)
{
    U64 bits[4];
    BYTE const* ip[4];
    BYTE* op[4];
    U16 const* const dtable = (U16 const*)args->dt;
    BYTE* const oend = args->oend;
    BYTE const* const ilowest = args->ilowest;

    /* Copy the arguments to local variables */
    ZSTD_memcpy(&bits, &args->bits, sizeof(bits));
    ZSTD_memcpy((void*)(&ip), &args->ip, sizeof(ip));
    ZSTD_memcpy(&op, &args->op, sizeof(op));

    assert(MEM_isLittleEndian());
    assert(!MEM_32bits());

    for (;;) {
        BYTE* olimit;
        int stream;

        /* Assert loop preconditions */
#ifndef NDEBUG
        for (stream = 0; stream < 4; ++stream) {
            assert(op[stream] <= (stream == 3 ? oend : op[stream + 1]));
            assert(ip[stream] >= ilowest);
        }
#endif
        /* Compute olimit */
        {
            /* Each iteration produces 5 output symbols per stream */
            size_t const oiters = (size_t)(oend - op[3]) / 5;
            /* Each iteration consumes up to 11 bits * 5 = 55 bits < 7 bytes
             * per stream.
             */
            size_t const iiters = (size_t)(ip[0] - ilowest) / 7;
            /* We can safely run iters iterations before running bounds checks */
            size_t const iters = MIN(oiters, iiters);
            size_t const symbols = iters * 5;

            /* We can simply check that op[3] < olimit, instead of checking all
             * of our bounds, since we can't hit the other bounds until we've run
             * iters iterations, which only happens when op[3] == olimit.
             */
            olimit = op[3] + symbols;

            /* Exit fast decoding loop once we reach the end. */
            if (op[3] == olimit)
                break;

            /* Exit the decoding loop if any input pointer has crossed the
             * previous one. This indicates corruption, and a precondition
             * to our loop is that ip[i] >= ip[0].
             */
            for (stream = 1; stream < 4; ++stream) {
                if (ip[stream] < ip[stream - 1])
                    goto _out;
            }
        }

#ifndef NDEBUG
        for (stream = 1; stream < 4; ++stream) {
            assert(ip[stream] >= ip[stream - 1]);
        }
#endif

#define HUF_4X1_DECODE_SYMBOL(_stream, _symbol)                 \
    do {                                                        \
        int const index = (int)(bits[(_stream)] >> 53);         \
        int const entry = (int)dtable[index];                   \
        bits[(_stream)] <<= (entry & 0x3F);                     \
        op[(_stream)][(_symbol)] = (BYTE)((entry >> 8) & 0xFF); \
    } while (0)

#define HUF_4X1_RELOAD_STREAM(_stream)                              \
    do {                                                            \
        int const ctz = ZSTD_countTrailingZeros64(bits[(_stream)]); \
        int const nbBits = ctz & 7;                                 \
        int const nbBytes = ctz >> 3;                               \
        op[(_stream)] += 5;                                         \
        ip[(_stream)] -= nbBytes;                                   \
        bits[(_stream)] = MEM_read64(ip[(_stream)]) | 1;            \
        bits[(_stream)] <<= nbBits;                                 \
    } while (0)

        /* Manually unroll the loop because compilers don't consistently
         * unroll the inner loops, which destroys performance.
         */
        do {
            /* Decode 5 symbols in each of the 4 streams */
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 1);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 2);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 3);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 4);

            /* Reload each of the 4 the bitstreams */
            HUF_4X_FOR_EACH_STREAM(HUF_4X1_RELOAD_STREAM);
        } while (op[3] < olimit);

#undef HUF_4X1_DECODE_SYMBOL
#undef HUF_4X1_RELOAD_STREAM
    }

_out:

    /* Save the final values of each of the state variables back to args. */
    ZSTD_memcpy(&args->bits, &bits, sizeof(bits));
    ZSTD_memcpy((void*)(&args->ip), &ip, sizeof(ip));
    ZSTD_memcpy(&args->op, &op, sizeof(op));
}